

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::Point::Jacobian(MatrixXd *__return_storage_ptr__,Point *this,MatrixXd *local)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ActualDstType actualDst;
  double __tmp;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  scalar_constant_op<double> local_38;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_30;
  
  uVar4 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
  local_38.m_other = 0.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp(&local_30,(ulong)uVar4,0,&local_38);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  if ((local_30.m_cols.m_value != 0 && local_30.m_rows.m_value != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816(local_30.m_cols.m_value),0) < local_30.m_rows.m_value)) {
    puVar5 = (undefined8 *)
             __cxa_allocate_exception
                       (8,local_30.m_rows.m_value,
                        SUB168(auVar2 % SEXT816(local_30.m_cols.m_value),0));
    *puVar5 = execv;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             local_30.m_rows.m_value,local_30.m_cols.m_value);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            (__return_storage_ptr__,&local_30,(assign_op<double,_double> *)&local_38);
  auVar3 = _DAT_00320030;
  auVar2 = _DAT_00320020;
  lVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols;
  if (0 < lVar6) {
    pdVar1 = (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    uVar7 = lVar6 + 0x1fffffffffffffff;
    uVar8 = uVar7 & 0x1fffffffffffffff;
    auVar9._8_4_ = (int)uVar8;
    auVar9._0_8_ = uVar8;
    auVar9._12_4_ = (int)(uVar8 >> 0x20);
    lVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00320030;
    do {
      auVar10._8_4_ = (int)lVar6;
      auVar10._0_8_ = lVar6;
      auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10 = (auVar10 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        pdVar1[lVar6] = local_30.m_functor.m_other;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        pdVar1[lVar6 + 1] = local_30.m_functor.m_other;
      }
      lVar6 = lVar6 + 2;
    } while ((uVar8 - ((uint)uVar7 & 1)) + 2 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Point::Jacobian(const Eigen::MatrixXd& local) const {
  return Eigen::MatrixXd::Zero(DimGlobal(), 0);
}